

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O0

char * zlib_wrapper_name(zlib_wrapper type)

{
  char *pcStack_10;
  zlib_wrapper type_local;
  
  if (type == kWrapperZLIB) {
    pcStack_10 = "ZLIB";
  }
  else if (type == kWrapperGZIP) {
    pcStack_10 = "GZIP";
  }
  else if (type == kWrapperZRAW) {
    pcStack_10 = "RAW";
  }
  else {
    error_exit("bad wrapper type",type);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* zlib_wrapper_name(zlib_wrapper type) {
  if (type == kWrapperZLIB)
    return "ZLIB";
  if (type == kWrapperGZIP)
    return "GZIP";
  if (type == kWrapperZRAW)
    return "RAW";
  error_exit("bad wrapper type", int(type));
  return nullptr;
}